

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void bssl::anon_unknown_0::ssl_test_ticket_aead_get_ex_index::anon_class_1_0_00000001::__invoke
               (void)

{
  anon_class_1_0_00000001 local_9;
  
  operator()(&local_9);
  return;
}

Assistant:

static int ssl_test_ticket_aead_get_ex_index() {
  CRYPTO_once(&g_ssl_test_ticket_aead_ex_index_once, [] {
    g_ssl_test_ticket_aead_ex_index = SSL_get_ex_new_index(
        0, nullptr, nullptr, ssl_test_ticket_aead_ex_index_dup,
        ssl_test_ticket_aead_ex_index_free);
  });
  return g_ssl_test_ticket_aead_ex_index;
}